

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O2

void dd_simplify_fname_c(char *s)

{
  char cVar1;
  long lVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  void *pvVar6;
  ulong uVar7;
  ulong uVar8;
  int iVar9;
  long lVar10;
  ulong uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  int iVar15;
  
  if (s == (char *)0x0) {
    return;
  }
  uVar5 = strlen(s);
  iVar9 = (int)uVar5;
  iVar4 = 8;
  if (iVar9 < 8) {
    iVar4 = iVar9;
  }
  pvVar6 = memchr(s,0x3a,(long)iVar4);
  if (pvVar6 != (void *)0x0) {
    lVar10 = ((long)pvVar6 + 3) - (long)s;
    if (((lVar10 < iVar9) && (*(char *)((long)pvVar6 + 1) == '/')) &&
       (*(char *)((long)pvVar6 + 2) == '/')) {
      uVar5 = (ulong)(uint)(iVar9 - (int)lVar10);
      s = (char *)((long)pvVar6 + 3);
    }
  }
LAB_0016593d:
  do {
    uVar7 = 0;
    if (0 < (int)uVar5) {
      uVar7 = uVar5 & 0xffffffff;
    }
    for (uVar11 = 0; uVar7 != uVar11; uVar11 = uVar11 + 1) {
      if ((0x20 < (ulong)(byte)s[uVar11]) ||
         ((0x100002600U >> ((ulong)(byte)s[uVar11] & 0x3f) & 1) == 0)) {
        uVar7 = uVar11 & 0xffffffff;
        break;
      }
    }
    iVar4 = (int)uVar7;
    if (iVar4 != 0) {
      uVar14 = (int)uVar5 - iVar4;
      uVar5 = (ulong)uVar14;
      memmove(s,s + uVar7,(long)(int)(uVar14 + 1));
    }
    uVar13 = (int)uVar5 - 1;
    uVar14 = uVar13;
    uVar12 = 0xffffffff;
    if ((int)uVar13 < -1) {
      uVar12 = uVar13;
    }
    while (((uVar3 = uVar12, -1 < (int)uVar14 && (uVar3 = uVar14, (ulong)(byte)s[uVar14] < 0x21)) &&
           ((0x100002600U >> ((ulong)(byte)s[uVar14] & 0x3f) & 1) != 0))) {
      uVar14 = uVar14 - 1;
    }
    lVar10 = (long)(int)uVar3;
    if ((int)uVar3 < (int)uVar13) {
      uVar5 = lVar10 + 1;
      s[lVar10 + 1] = '\0';
    }
    iVar9 = (int)uVar5;
    uVar7 = 0;
    if (0 < iVar9) {
      uVar7 = uVar5 & 0xffffffff;
    }
    uVar11 = 0xffffffffffffffff;
    for (uVar8 = 0; uVar7 != uVar8; uVar8 = uVar8 + 1) {
      if (s[uVar8] == '\"') {
        goto LAB_001659f7;
      }
      uVar11 = uVar11 + 1;
    }
LAB_00165a48:
    if ((int)uVar3 >= (int)uVar13 && iVar4 == 0) {
      for (lVar10 = 1; lVar10 < iVar9; lVar10 = lVar10 + 1) {
        if (s[lVar10] == '\\') {
          s[lVar10] = '/';
        }
      }
      iVar4 = 1;
      while( true ) {
        iVar15 = (int)uVar5;
        iVar9 = iVar15 - iVar4;
        if (iVar9 == 0 || iVar15 < iVar4) break;
        if ((s[iVar4] == '/') && (s[(long)iVar4 + -1] == '/')) {
          lVar10 = (long)iVar4;
          iVar4 = iVar4 + -1;
          memmove(s + lVar10,s + lVar10 + 1,(long)iVar9);
          uVar5 = (ulong)(iVar15 - 1);
        }
        iVar4 = iVar4 + 1;
      }
      uVar5 = uVar5 & 0xffffffff;
      while (((1 < (int)uVar5 && (*s == '.')) && (s[1] == '/'))) {
        memmove(s,s + 2,uVar5 - 1);
        uVar5 = uVar5 - 2;
      }
      iVar4 = 1;
      while (iVar4 < (int)uVar5) {
        iVar9 = iVar4;
        if (((s[iVar4] == '.') && ((s[(long)iVar4 + -1] == ':' || (s[(long)iVar4 + -1] == '/')))) &&
           ((cVar1 = s[(long)iVar4 + 1], cVar1 == '/' || (cVar1 == '\0')))) {
          iVar9 = iVar4 + -1;
          uVar14 = (int)uVar5 + ~(uint)(cVar1 == '/');
          uVar5 = (ulong)uVar14;
          memmove(s + iVar4,s + iVar4 + (ulong)(cVar1 == '/') + 1,(long)(int)((uVar14 - iVar4) + 1))
          ;
        }
        iVar4 = iVar9 + 1;
      }
      for (iVar4 = 2; iVar4 < (int)uVar5; iVar4 = iVar4 + 1) {
        if (((s[(long)iVar4 + -2] == '/') && (s[(long)iVar4 + -1] == '.')) &&
           ((s[iVar4] == '.' && ((cVar1 = s[(long)iVar4 + 1], cVar1 == '\0' || (cVar1 == '/')))))) {
          uVar13 = iVar4 - 3;
          uVar14 = 0xffffffff;
          if ((int)uVar13 < -1) {
            uVar14 = uVar13;
          }
          for (; ((uVar12 = uVar14, -1 < (int)uVar13 && (uVar12 = uVar13, s[uVar13] != '/')) &&
                 (s[uVar13] != ':')); uVar13 = uVar13 - 1) {
          }
          lVar10 = (long)(int)uVar12 + 1;
          iVar9 = (int)lVar10;
          if ((iVar9 < iVar4 + -2) &&
             (((iVar4 - uVar12 != 5 || (s[lVar10] != '.')) || (s[(long)(int)uVar12 + 2] != '.')))) {
            iVar4 = (iVar4 - uVar12) + (uint)(cVar1 == '/');
            uVar14 = (int)uVar5 - iVar4;
            uVar5 = (ulong)uVar14;
            memmove(s + lVar10,s + lVar10 + iVar4,(long)(int)(uVar14 - uVar12));
            iVar4 = 1;
            if (1 < iVar9) {
              iVar4 = iVar9;
            }
          }
        }
      }
      return;
    }
  } while( true );
  while (uVar7 = uVar11 + 1, lVar2 = uVar11 + 2, uVar11 = uVar7, s[lVar2] != '\"') {
LAB_001659f7:
    if (iVar9 <= (int)uVar11 + 2) goto LAB_00165a48;
  }
  memmove(s + uVar8,s + uVar8 + 1,(long)iVar9 - uVar8);
  if (lVar10 < (int)uVar13) {
    uVar13 = uVar3;
  }
  memmove(s + (uVar7 & 0xffffffff),s + (uVar7 & 0xffffffff) + 1,(long)(int)(uVar13 - (int)uVar7));
  uVar5 = (ulong)(iVar9 - 2);
  goto LAB_0016593d;
}

Assistant:

void dd_simplify_fname_c(char *s)
{
  if(!s) return;
  int i,len=strlen(s);

  // check for URL format to prevent removal of ://
  if (char *semi = (char*)memchr(s, ':', len > 8 ? 8 : len))
    if (len > (semi+3-s) && semi[1] == '/' && semi[2] == '/')
    {
      len -= int(semi+3-s);
      s = semi+3;
    }

  for(;;) {
    bool ok=false;
    // remove leading spaces
    for(i=0;i<len;++i)
      if(s[i]!=' ' && s[i]!='\t' && s[i]!='\n' && s[i]!='\r') break;
    if(i>0) {len-=i;memmove(s,s+i,len+1); ok=true;}
    // remove trailing spaces
    for(i=len-1;i>=0;--i)
      if(s[i]!=' ' && s[i]!='\t' && s[i]!='\n' && s[i]!='\r') break;
    if(i<len-1) {s[len=i+1]=0; ok=true;}
    // remove quotes
    for(i=0;i<len;++i) if(s[i]=='"') break;
    if(i<len) {
      int qs=i;
      for(++i;i<len;++i) if(s[i]=='"') break;
      if(i<len) {
        memmove(s+qs,s+qs+1,len-qs); --len; --i;
        memmove(s+i,s+i+1,len-i); --len;
        ok=true;
      }
    }
    if(!ok) break;
  }

  // replace all back slashes with normal ones
  for(i=1;i<len;++i)
    if(s[i]==PATH_DELIM_BACK )
      s[i]=PATH_DELIM;

  // remove extra slashes
  for(i=1;i<len;++i) if(s[i]==PATH_DELIM)
    if(s[i-1]==PATH_DELIM)
      {memmove(s+i,s+i+1,len-i); --len; --i;}

  // remove extra cur-dirs
  while (len>1)
    if (s[0]=='.' && s[1]==PATH_DELIM)
    {
      len-=2;
      memmove(s,s+2,len+1);
    }
    else
      break;

  for(i=1;i<len;++i) if(s[i]=='.' && (s[i-1]==PATH_DELIM || s[i-1]==':'))
    if(s[i+1]==PATH_DELIM || s[i+1]==0) {
      int e=1; if(s[i+1]==PATH_DELIM) ++e;
      len-=e; memmove(s+i,s+i+e,len+1-i);
      --i;
    }

  // remove extra up-dirs
  for (i=2; i<len; ++i) if (s[i-2]==PATH_DELIM && s[i-1]=='.' && s[i]=='.')
    if (s[i+1]==PATH_DELIM || s[i+1]==0)
    {
      int j;
      for (j=i-3;j>=0;--j) if(s[j]==PATH_DELIM || s[j]==':') break;

      if (++j<i-2)
      {
        int e=i+1-j;

        if (e!=5 || s[j]!='.' || s[j+1]!='.')
        {
          if (s[i+1]==PATH_DELIM) ++e;

          len-=e; memmove(s+j, s+j+e, len+1-j);
          i=std::max(j,1);
        }
      }
    }
}